

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::cMoveUp(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Char value;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  requireDStackDepth(this,3,"CMOVE>");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar1 != 0) {
    do {
      value = dataSpaceAt(this,(uVar3 - 1) + uVar1);
      dataSpaceSet(this,(uVar2 - 1) + uVar1,value);
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void cMoveUp() {
			REQUIRE_DSTACK_DEPTH(3, "CMOVE>");
			auto length = dStack.getTop(); pop();
			auto dst = CADDR(dStack.getTop()); pop();
			auto src = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				auto offset = length - i - 1;
				dataSpaceSet(dst + offset, dataSpaceAt(src + offset));
			}
		}